

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode UA_SecureChannel_sendChunk(UA_ChunkInfo *ci,UA_ByteString *dst,size_t offset)

{
  uint uVar1;
  UA_SecureChannel *pUVar2;
  UA_Connection *pUVar3;
  size_t sVar4;
  UA_StatusCode UVar5;
  UA_Byte *pUVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  UA_UInt32 UVar10;
  size_t sVar11;
  undefined8 uStack_68;
  UA_SequenceHeader seqHeader;
  UA_StatusCode *local_48;
  int local_40;
  undefined4 local_3c;
  UA_UInt32 local_38;
  UA_UInt32 local_34 [2];
  UA_SymmetricAlgorithmSecurityHeader symSecHeader;
  
  pUVar2 = ci->channel;
  pUVar3 = pUVar2->connection;
  if (pUVar3 == (UA_Connection *)0x0) {
    return 0x80020000;
  }
  sVar4 = dst->length;
  pos = dst->data;
  pUVar6 = pos + -0x18;
  dst->data = pUVar6;
  dst->length = sVar4 + 0x18;
  sVar11 = offset + 0x18;
  uVar7 = ci->messageSizeSoFar + sVar11;
  uVar9 = (ulong)(pUVar3->remoteConf).maxMessageSize;
  if (uVar9 < uVar7 && uVar9 != 0) {
    ci->errorCode = 0x80b90000;
  }
  uVar8 = *(int *)&ci->chunksSoFar + 1;
  ci->chunksSoFar = (UA_UInt16)uVar8;
  uVar1 = (pUVar3->remoteConf).maxChunkCount;
  if (uVar1 == 0 || (uVar8 & 0xffff) <= uVar1) {
    local_38 = (pUVar2->securityToken).channelId;
    UVar10 = ci->messageType;
    if (ci->errorCode == 0) {
      if (ci->final == true) {
        local_40 = UVar10 + 0x46000000;
      }
      else {
        local_40 = UVar10 + 0x43000000;
      }
      goto LAB_0011470e;
    }
  }
  else {
    ci->errorCode = 0x80b90000;
    local_38 = (pUVar2->securityToken).channelId;
    UVar10 = ci->messageType;
  }
  ci->final = true;
  local_40 = UVar10 + 0x41000000;
  uStack_68 = 0;
  seqHeader.sequenceNumber = 0;
  seqHeader.requestId = 0;
  end = pos + sVar4;
  exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
  exchangeBufferCallbackHandle = (void *)0x0;
  encodeBuf = dst;
  UA_encodeBinaryInternal(&ci->errorCode,UA_TYPES + 6);
  end = dst->data + dst->length;
  exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
  exchangeBufferCallbackHandle = (void *)0x0;
  encodeBuf = dst;
  UA_encodeBinaryInternal(&uStack_68,UA_TYPES + 0xb);
  pUVar6 = dst->data;
  sVar11 = (long)pos - (long)pUVar6;
  uVar7 = ci->messageSizeSoFar + sVar11;
LAB_0011470e:
  local_48 = &ci->errorCode;
  local_3c = (undefined4)sVar11;
  ci->messageSizeSoFar = uVar7;
  local_34[0] = (pUVar2->securityToken).tokenId;
  UVar10 = ci->requestId;
  pUVar2->sendSequenceNumber = pUVar2->sendSequenceNumber + 1;
  uStack_68 = CONCAT44(UVar10,pUVar2->sendSequenceNumber);
  end = pUVar6 + dst->length;
  exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
  exchangeBufferCallbackHandle = (void *)0x0;
  pos = pUVar6;
  encodeBuf = dst;
  UA_encodeBinaryInternal(&local_40,UA_TRANSPORT + 0xb);
  end = dst->data + dst->length;
  exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
  exchangeBufferCallbackHandle = (void *)0x0;
  encodeBuf = dst;
  UA_encodeBinaryInternal(local_34,UA_TRANSPORT + 10);
  end = dst->data + dst->length;
  exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
  exchangeBufferCallbackHandle = (void *)0x0;
  encodeBuf = dst;
  UA_encodeBinaryInternal(&uStack_68,UA_TRANSPORT + 7);
  dst->length = sVar11;
  (*pUVar3->send)(pUVar2->connection,dst);
  if (ci->final == false) {
    UVar5 = (*pUVar3->getSendBuffer)(pUVar3,(size_t)(pUVar3->localConf).sendBufferSize,dst);
    if (UVar5 != 0) {
      return UVar5;
    }
    dst->data = dst->data + 0x18;
    dst->length = (ulong)((pUVar3->localConf).sendBufferSize - 0x18);
  }
  return *local_48;
}

Assistant:

static UA_StatusCode
UA_SecureChannel_sendChunk(UA_ChunkInfo *ci, UA_ByteString *dst, size_t offset) {
    UA_SecureChannel *channel = ci->channel;
    UA_Connection *connection = channel->connection;
    if(!connection)
       return UA_STATUSCODE_BADINTERNALERROR;

    /* adjust the buffer where the header was hidden */
    dst->data = &dst->data[-UA_SECURE_MESSAGE_HEADER_LENGTH];
    dst->length += UA_SECURE_MESSAGE_HEADER_LENGTH;
    offset += UA_SECURE_MESSAGE_HEADER_LENGTH;

    if(ci->messageSizeSoFar + offset > connection->remoteConf.maxMessageSize &&
       connection->remoteConf.maxMessageSize > 0)
        ci->errorCode = UA_STATUSCODE_BADRESPONSETOOLARGE;
    if(++ci->chunksSoFar > connection->remoteConf.maxChunkCount &&
       connection->remoteConf.maxChunkCount > 0)
        ci->errorCode = UA_STATUSCODE_BADRESPONSETOOLARGE;

    /* Prepare the chunk headers */
    UA_SecureConversationMessageHeader respHeader;
    respHeader.secureChannelId = channel->securityToken.channelId;
    respHeader.messageHeader.messageTypeAndChunkType = ci->messageType;
    if(ci->errorCode == UA_STATUSCODE_GOOD) {
        if(ci->final)
            respHeader.messageHeader.messageTypeAndChunkType += UA_CHUNKTYPE_FINAL;
        else
            respHeader.messageHeader.messageTypeAndChunkType += UA_CHUNKTYPE_INTERMEDIATE;
    } else {
        /* abort message */
        ci->final = true; /* mark as finished */
        respHeader.messageHeader.messageTypeAndChunkType += UA_CHUNKTYPE_ABORT;
        UA_String errorMsg;
        UA_String_init(&errorMsg);
        offset = UA_SECURE_MESSAGE_HEADER_LENGTH;
        UA_UInt32_encodeBinary(&ci->errorCode, dst, &offset);
        UA_String_encodeBinary(&errorMsg, dst, &offset);
    }
    respHeader.messageHeader.messageSize = (UA_UInt32)offset;
    ci->messageSizeSoFar += offset;

    /* Encode the header at the beginning of the buffer */
    UA_SymmetricAlgorithmSecurityHeader symSecHeader;
    symSecHeader.tokenId = channel->securityToken.tokenId;
    UA_SequenceHeader seqHeader;
    seqHeader.requestId = ci->requestId;
    seqHeader.sequenceNumber = UA_atomic_add(&channel->sendSequenceNumber, 1);
    size_t offset_header = 0;
    UA_SecureConversationMessageHeader_encodeBinary(&respHeader, dst, &offset_header);
    UA_SymmetricAlgorithmSecurityHeader_encodeBinary(&symSecHeader, dst, &offset_header);
    UA_SequenceHeader_encodeBinary(&seqHeader, dst, &offset_header);

    /* Send the chunk, the buffer is freed in the network layer */
    dst->length = offset; /* set the buffer length to the content length */
    connection->send(channel->connection, dst);

    /* Replace with the buffer for the next chunk */
    if(!ci->final) {
        UA_StatusCode retval =
            connection->getSendBuffer(connection, connection->localConf.sendBufferSize, dst);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        /* Forward the data pointer so that the payload is encoded after the message header.
         * TODO: This works but is a bit too clever. Instead, we could return an offset to the
         * binary encoding exchangeBuffer function. */
        dst->data = &dst->data[UA_SECURE_MESSAGE_HEADER_LENGTH];
        dst->length = connection->localConf.sendBufferSize - UA_SECURE_MESSAGE_HEADER_LENGTH;
    }
    return ci->errorCode;
}